

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

void __thiscall duckdb::UnixFileHandle::~UnixFileHandle(UnixFileHandle *this)

{
  ~UnixFileHandle(this);
  operator_delete(this);
  return;
}

Assistant:

~UnixFileHandle() override {
		UnixFileHandle::Close();
	}